

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O3

int __thiscall SocketOnline::recv_message_int(SocketOnline *this)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char *__buf;
  char *p;
  char *local_28;
  
  iVar2 = this->sock;
  __buf = this->buffer;
  iVar1 = 0;
  do {
    sVar3 = read(iVar2,__buf,(ulong)(4 - iVar1));
    __buf = __buf + (int)sVar3;
    iVar1 = (int)sVar3 + iVar1;
  } while (iVar1 < 4);
  this->recv_num = this->recv_num + 4;
  local_28 = this->buffer;
  iVar2 = Constant::Util::char_to_int(&local_28);
  return iVar2;
}

Assistant:

int SocketOnline::recv_message_int() {
    recv_message_n(sock, buffer, 4);
    char* p = buffer;
    int ret = Constant::Util::char_to_int(p);
    return ret;
}